

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeXMLWriter.cpp
# Opt level: O2

streamsize __thiscall
xe::xml::EscapeStreambuf::xsputn(EscapeStreambuf *this,char *s,streamsize count)

{
  long lVar1;
  char *__s;
  long lVar2;
  ostream *poVar3;
  char *pcVar4;
  long lVar5;
  
  lVar5 = 0;
  lVar1 = 0;
  if (0 < count) {
    lVar1 = count;
  }
  do {
    lVar2 = 0;
    pcVar4 = s;
    while( true ) {
      if (lVar5 - lVar1 == lVar2) {
        if ((lVar5 < count) &&
           (std::ostream::write((char *)this->m_dst,(long)(s + lVar5)),
           ((byte)this->m_dst[*(long *)(*(long *)this->m_dst + -0x18) + 0x20] & 5) != 0)) {
          return lVar5;
        }
        return count;
      }
      __s = getEscapeEntity(pcVar4[lVar5]);
      if (__s != (char *)0x0) break;
      lVar2 = lVar2 + -1;
      pcVar4 = pcVar4 + 1;
    }
    poVar3 = this->m_dst;
    if (lVar5 < lVar5 - lVar2) {
      std::ostream::write((char *)poVar3,(long)(s + lVar5));
      poVar3 = this->m_dst;
      if (((byte)poVar3[*(long *)(*(long *)poVar3 + -0x18) + 0x20] & 5) != 0) {
        return lVar5;
      }
    }
    strlen(__s);
    std::ostream::write((char *)poVar3,(long)__s);
    lVar5 = (lVar5 - lVar2) + 1;
  } while( true );
}

Assistant:

std::streamsize EscapeStreambuf::xsputn (const char* s, std::streamsize count)
{
	std::streamsize	numWritten = 0;

	for (std::streamsize inPos = 0; inPos < count; inPos++)
	{
		const char* entity = getEscapeEntity(s[inPos]);

		if (entity)
		{
			// Flush data prior to entity.
			if (inPos > numWritten)
			{
				m_dst.write(s + numWritten, inPos-numWritten);
				if (m_dst.fail())
					return numWritten;
			}

			// Flush entity value
			m_dst.write(entity, (std::streamsize)strlen(entity));

			numWritten = inPos+1;
		}
	}

	if (numWritten < count)
	{
		m_dst.write(s + numWritten, count-numWritten);
		if (m_dst.fail())
			return numWritten;
	}

	return count;
}